

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayGet * __thiscall
wasm::Builder::makeArrayGet(Builder *this,Expression *ref,Expression *index,Type type,bool signed_)

{
  ArrayGet *pAVar1;
  ArrayGet *ret;
  bool signed__local;
  Expression *index_local;
  Expression *ref_local;
  Builder *this_local;
  Type type_local;
  
  pAVar1 = MixedArena::alloc<wasm::ArrayGet>(&this->wasm->allocator);
  pAVar1->ref = ref;
  pAVar1->index = index;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)74>).super_Expression.type.id = type.id;
  pAVar1->signed_ = signed_;
  wasm::ArrayGet::finalize();
  return pAVar1;
}

Assistant:

ArrayGet* makeArrayGet(Expression* ref,
                         Expression* index,
                         Type type,
                         bool signed_ = false) {
    auto* ret = wasm.allocator.alloc<ArrayGet>();
    ret->ref = ref;
    ret->index = index;
    ret->type = type;
    ret->signed_ = signed_;
    ret->finalize();
    return ret;
  }